

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fossilize_replay_linux.hpp
# Opt level: O0

void __thiscall ProcessProgress::parse(ProcessProgress *this,char *cmd)

{
  int iVar1;
  long lVar2;
  pair<std::__detail::_Node_iterator<unsigned_long,_true,_false>,_bool> pVar3;
  char local_1f8 [8];
  char buffer_4 [64];
  ulonglong local_1a8;
  ulonglong local_1a0;
  unsigned_long_long hash;
  char buffer_3 [64];
  Hash compute_pipeline;
  char *end_2;
  char buffer_2 [64];
  Hash raytracing_pipeline;
  char *end_1;
  char buffer_1 [64];
  Hash graphics_pipeline;
  char *end;
  char buffer [64];
  undefined1 local_5c [8];
  epoll_event event;
  itimerspec spec;
  char *cmd_local;
  ProcessProgress *this_local;
  
  iVar1 = strncmp(cmd,"CRASH",5);
  if (iVar1 == 0) {
    close_and_remove_epoll_entry(&this->timer_fd);
    iVar1 = timerfd_create(1,0x80000);
    this->timer_fd = iVar1;
    if (this->timer_fd < 0) {
      fprintf(_stderr,
              "Fossilize ERROR: Failed to create timerfd. Cannot support timeout for process.\n");
      fflush(_stderr);
    }
    else {
      memset(&event.data,0,0x20);
      iVar1 = timerfd_settime(this->timer_fd,0,(itimerspec *)&event.data,(itimerspec *)0x0);
      if (iVar1 < 0) {
        fprintf(_stderr,"Fossilize ERROR: Failed to set time with timerfd_settime.\n");
        fflush(_stderr);
      }
      memset(local_5c,0,0xc);
      local_5c._4_4_ = this->index | 0x80000000;
      local_5c._0_4_ = 1;
      iVar1 = epoll_ctl(Global::epoll_fd,1,this->timer_fd,(epoll_event *)local_5c);
      if (iVar1 != 0) {
        fprintf(_stderr,"Fossilize ERROR: Failed adding timer_fd to epoll_ctl().\n");
        fflush(_stderr);
      }
    }
  }
  else {
    iVar1 = strncmp(cmd,"GRAPHICS_VERR",0xd);
    if (((iVar1 == 0) || (iVar1 = strncmp(cmd,"RAYTRACE_VERR",0xd), iVar1 == 0)) ||
       (iVar1 = strncmp(cmd,"COMPUTE_VERR",0xc), iVar1 == 0)) {
      if (Global::control_block != (SharedControlBlock *)0x0) {
        memset(&end,0,0x40);
        strcpy((char *)&end,cmd);
        Fossilize::futex_wrapper_lock(&Global::control_block->futex_lock);
        Fossilize::shared_control_block_write(Global::control_block,&end,0x40);
        Fossilize::futex_wrapper_unlock(&Global::control_block->futex_lock);
      }
    }
    else {
      iVar1 = strncmp(cmd,"GRAPHICS",8);
      if (iVar1 == 0) {
        graphics_pipeline = 0;
        lVar2 = strtol(cmd + 8,(char **)&graphics_pipeline,0);
        this->graphics_progress = (int)lVar2;
        if ((((graphics_pipeline != 0) &&
             (buffer_1._56_8_ = strtoull((char *)graphics_pipeline,(char **)0x0,0x10),
             Global::control_block != (SharedControlBlock *)0x0)) && (0 < this->graphics_progress))
           && (buffer_1._56_8_ != 0)) {
          sprintf((char *)&end_1,"GRAPHICS %d %lx\n",(ulong)(this->graphics_progress - 1),
                  buffer_1._56_8_);
          Fossilize::futex_wrapper_lock(&Global::control_block->futex_lock);
          Fossilize::shared_control_block_write(Global::control_block,&end_1,0x40);
          Fossilize::futex_wrapper_unlock(&Global::control_block->futex_lock);
        }
      }
      else {
        iVar1 = strncmp(cmd,"RAYTRACE",8);
        if (iVar1 == 0) {
          raytracing_pipeline = 0;
          lVar2 = strtol(cmd + 8,(char **)&raytracing_pipeline,0);
          this->raytracing_progress = (int)lVar2;
          if (((raytracing_pipeline != 0) &&
              (buffer_2._56_8_ = strtoull((char *)raytracing_pipeline,(char **)0x0,0x10),
              Global::control_block != (SharedControlBlock *)0x0)) &&
             ((0 < this->raytracing_progress && (buffer_2._56_8_ != 0)))) {
            sprintf((char *)&end_2,"RAYTRACE %d %lx\n",(ulong)(this->raytracing_progress - 1),
                    buffer_2._56_8_);
            Fossilize::futex_wrapper_lock(&Global::control_block->futex_lock);
            Fossilize::shared_control_block_write(Global::control_block,&end_2,0x40);
            Fossilize::futex_wrapper_unlock(&Global::control_block->futex_lock);
          }
        }
        else {
          iVar1 = strncmp(cmd,"COMPUTE",7);
          if (iVar1 == 0) {
            compute_pipeline = 0;
            lVar2 = strtol(cmd + 7,(char **)&compute_pipeline,0);
            this->compute_progress = (int)lVar2;
            if (((compute_pipeline != 0) &&
                (buffer_3._56_8_ = strtoull((char *)compute_pipeline,(char **)0x0,0x10),
                Global::control_block != (SharedControlBlock *)0x0)) &&
               ((0 < this->compute_progress && (buffer_3._56_8_ != 0)))) {
              sprintf((char *)&hash,"COMPUTE %d %lx\n",(ulong)(this->compute_progress - 1),
                      buffer_3._56_8_);
              Fossilize::futex_wrapper_lock(&Global::control_block->futex_lock);
              Fossilize::shared_control_block_write(Global::control_block,&hash,0x40);
              Fossilize::futex_wrapper_unlock(&Global::control_block->futex_lock);
            }
          }
          else {
            iVar1 = strncmp(cmd,"MODULE_UUID",0xb);
            if (iVar1 == 0) {
              *(undefined8 *)this->module_uuid_path = *(undefined8 *)(cmd + 0xc);
              *(undefined8 *)(this->module_uuid_path + 8) = *(undefined8 *)(cmd + 0x14);
              *(undefined8 *)(this->module_uuid_path + 0x10) = *(undefined8 *)(cmd + 0x1c);
              *(undefined8 *)(this->module_uuid_path + 0x18) = *(undefined8 *)(cmd + 0x24);
            }
            else {
              iVar1 = strncmp(cmd,"MODULE",6);
              if (iVar1 == 0) {
                local_1a8 = strtoull(cmd + 6,(char **)0x0,0x10);
                local_1a0 = local_1a8;
                pVar3 = std::
                        unordered_set<unsigned_long,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<unsigned_long>_>
                        ::insert((unordered_set<unsigned_long,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<unsigned_long>_>
                                  *)Global::faulty_spirv_modules,&local_1a8);
                buffer_4._56_8_ = pVar3.first.super__Node_iterator_base<unsigned_long,_false>._M_cur
                ;
                if (Global::control_block != (SharedControlBlock *)0x0) {
                  LOCK();
                  (Global::control_block->banned_modules).super___atomic_base<unsigned_int>._M_i =
                       (Global::control_block->banned_modules).super___atomic_base<unsigned_int>.
                       _M_i + 1;
                  UNLOCK();
                  memset(local_1f8,0,0x40);
                  strcpy(local_1f8,cmd);
                  Fossilize::futex_wrapper_lock(&Global::control_block->futex_lock);
                  Fossilize::shared_control_block_write(Global::control_block,local_1f8,0x40);
                  Fossilize::futex_wrapper_unlock(&Global::control_block->futex_lock);
                }
              }
              else {
                iVar1 = strncmp(cmd,"BEGIN_HEARTBEAT",0xf);
                if (iVar1 == 0) {
                  begin_heartbeat(this);
                }
                else {
                  iVar1 = strncmp(cmd,"HEARTBEAT",9);
                  if (iVar1 == 0) {
                    heartbeat(this);
                  }
                  else {
                    fprintf(_stderr,"Fossilize ERROR: Got unexpected message from child: %s\n",cmd);
                    fflush(_stderr);
                  }
                }
              }
            }
          }
        }
      }
    }
  }
  return;
}

Assistant:

void ProcessProgress::parse(const char *cmd)
{
	if (strncmp(cmd, "CRASH", 5) == 0)
	{
		// We crashed ... Set up a timeout in case the process hangs while trying to recover.
		close_and_remove_epoll_entry(timer_fd);
		timer_fd = timerfd_create(CLOCK_MONOTONIC, TFD_CLOEXEC);

		if (timer_fd >= 0)
		{
			struct itimerspec spec = {};
			spec.it_value.tv_sec = 3;
			if (timerfd_settime(timer_fd, 0, &spec, nullptr) < 0)
				LOGE("Failed to set time with timerfd_settime.\n");

			struct epoll_event event = {};
			event.data.u32 = 0x80000000u | index;
			event.events = EPOLLIN;
			if (epoll_ctl(Global::epoll_fd, EPOLL_CTL_ADD, timer_fd, &event))
				LOGE("Failed adding timer_fd to epoll_ctl().\n");
		}
		else
			LOGE("Failed to create timerfd. Cannot support timeout for process.\n");
	}
	else if (strncmp(cmd, "GRAPHICS_VERR", 13) == 0 ||
	         strncmp(cmd, "RAYTRACE_VERR", 13) == 0 ||
	         strncmp(cmd, "COMPUTE_VERR", 12) == 0)
	{
		if (Global::control_block)
		{
			// Just forward the message.
			char buffer[ControlBlockMessageSize] = {};
			strcpy(buffer, cmd);

			futex_wrapper_lock(&Global::control_block->futex_lock);
			shared_control_block_write(Global::control_block, buffer, sizeof(buffer));
			futex_wrapper_unlock(&Global::control_block->futex_lock);
		}
	}
	else if (strncmp(cmd, "GRAPHICS", 8) == 0)
	{
		char *end = nullptr;
		graphics_progress = int(strtol(cmd + 8, &end, 0));
		if (end)
		{
			Hash graphics_pipeline = strtoull(end, nullptr, 16);
			// graphics_progress tells us where to start on next iteration, but -1 was actually the pipeline index that crashed.
			if (Global::control_block && graphics_progress > 0 && graphics_pipeline != 0)
			{
				char buffer[ControlBlockMessageSize];
				sprintf(buffer, "GRAPHICS %d %" PRIx64 "\n", graphics_progress - 1, graphics_pipeline);
				futex_wrapper_lock(&Global::control_block->futex_lock);
				shared_control_block_write(Global::control_block, buffer, sizeof(buffer));
				futex_wrapper_unlock(&Global::control_block->futex_lock);
			}
		}
	}
	else if (strncmp(cmd, "RAYTRACE", 8) == 0)
	{
		char *end = nullptr;
		raytracing_progress = int(strtol(cmd + 8, &end, 0));
		if (end)
		{
			Hash raytracing_pipeline = strtoull(end, nullptr, 16);
			// raytracing_progress tells us where to start on next iteration, but -1 was actually the pipeline index that crashed.
			if (Global::control_block && raytracing_progress > 0 && raytracing_pipeline != 0)
			{
				char buffer[ControlBlockMessageSize];
				sprintf(buffer, "RAYTRACE %d %" PRIx64 "\n", raytracing_progress - 1, raytracing_pipeline);
				futex_wrapper_lock(&Global::control_block->futex_lock);
				shared_control_block_write(Global::control_block, buffer, sizeof(buffer));
				futex_wrapper_unlock(&Global::control_block->futex_lock);
			}
		}
	}
	else if (strncmp(cmd, "COMPUTE", 7) == 0)
	{
		char *end = nullptr;
		compute_progress = int(strtol(cmd + 7, &end, 0));
		if (end)
		{
			Hash compute_pipeline = strtoull(end, nullptr, 16);
			// compute_progress tells us where to start on next iteration, but -1 was actually the pipeline index that crashed.
			if (Global::control_block && compute_progress > 0 && compute_pipeline)
			{
				char buffer[ControlBlockMessageSize];
				sprintf(buffer, "COMPUTE %d %" PRIx64 "\n", compute_progress - 1, compute_pipeline);
				futex_wrapper_lock(&Global::control_block->futex_lock);
				shared_control_block_write(Global::control_block, buffer, sizeof(buffer));
				futex_wrapper_unlock(&Global::control_block->futex_lock);
			}
		}
	}
	else if (strncmp(cmd, "MODULE_UUID", 11) == 0)
	{
		memcpy(module_uuid_path, cmd + 12, VK_UUID_SIZE * 2);
	}
	else if (strncmp(cmd, "MODULE", 6) == 0)
	{
		auto hash = strtoull(cmd + 6, nullptr, 16);
		Global::faulty_spirv_modules.insert(hash);

		if (Global::control_block)
		{
			Global::control_block->banned_modules.fetch_add(1, std::memory_order_relaxed);
			char buffer[ControlBlockMessageSize] = {};
			strcpy(buffer, cmd);

			futex_wrapper_lock(&Global::control_block->futex_lock);
			shared_control_block_write(Global::control_block, buffer, sizeof(buffer));
			futex_wrapper_unlock(&Global::control_block->futex_lock);
		}
	}
	else if (strncmp(cmd, "BEGIN_HEARTBEAT", 15) == 0)
	{
		begin_heartbeat();
	}
	else if (strncmp(cmd, "HEARTBEAT", 9) == 0)
	{
		heartbeat();
	}
	else
		LOGE("Got unexpected message from child: %s\n", cmd);
}